

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *Fi,bool Mfactor,bool Kfactor,
          bool Rfactor,bool Gfactor)

{
  undefined1 (*pauVar1) [64];
  long *plVar2;
  undefined1 (*pauVar3) [32];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer psVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  double *pdVar14;
  byte bVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  ChVectorDynamic<> *pCVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  double dVar24;
  ActualDstType actualDst;
  ChElementBeamTaperedTimoshenko *pCVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  double dVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  undefined3 in_register_00000089;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  ulong uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  ChVectorDynamic<> FiMKR_local;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChMatrix33<double> AtolocwelA;
  ChVector<double> mFcent_i;
  ChMatrix33<double> Atoabs;
  ChVector<double> mTgyro_i;
  ChMatrix33<double> AtolocwelB;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_268;
  ChElementBeamTaperedTimoshenko *local_250;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_248;
  ChVectorDynamic<> *local_230;
  ChMatrix33<double> local_228;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_1d8;
  long local_190 [3];
  ChMatrix33<double> CStack_178;
  double local_128 [4];
  ChMatrix33<double> local_108;
  undefined1 local_b8 [16];
  ChMatrixRef local_a0;
  undefined1 local_78 [16];
  double dStack_68;
  double dStack_60;
  
  auVar35 = _local_78;
  local_78._1_3_ = in_register_00000089;
  local_78[0] = Gfactor;
  local_230 = Fi;
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x44c,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &, bool, bool, bool, bool)"
                 );
  }
  stack0xffffffffffffff8c = auVar35._4_60_;
  local_250 = this;
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x44d,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &, bool, bool, bool, bool)"
                 );
  }
  local_268.m_storage.m_data = (double *)0x0;
  local_268.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_268,0xc);
  if (local_268.m_storage.m_rows < 0) {
LAB_00672b2d:
    pcVar21 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_00672b42;
  }
  if ((double)local_268.m_storage.m_rows != 0.0) {
    memset(local_268.m_storage.m_data,0,local_268.m_storage.m_rows << 3);
  }
  pCVar25 = local_250;
  if (Mfactor) {
    CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&CStack_178,0xc);
    GetField_dtdt(pCVar25,(ChVectorDynamic<> *)&CStack_178);
    if ((double)(pCVar25->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols !=
        CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
    goto LAB_00672b4c;
    local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_228,
               (pCVar25->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows,1);
    dVar27 = (double)(pCVar25->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
    if (local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
        dVar27) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_228,
                 (Index)dVar27,1);
      dVar27 = local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
    }
    if ((long)dVar27 < 0) goto LAB_00672b2d;
    if (dVar27 != 0.0) {
      memset((void *)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0],0,(long)dVar27 << 3);
    }
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_228,&pCVar25->M,
               (Matrix<double,__1,_1,_0,__1,_1> *)&CStack_178,(Scalar *)&local_108);
    if ((double)local_268.m_storage.m_rows ==
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) {
      dVar27 = (double)(local_268.m_storage.m_rows + 7);
      if (-1 < local_268.m_storage.m_rows) {
        dVar27 = (double)local_268.m_storage.m_rows;
      }
      dVar27 = (double)((ulong)dVar27 & 0xfffffffffffffff8);
      if (7 < local_268.m_storage.m_rows) {
        lVar29 = 0;
        do {
          auVar35 = vsubpd_avx512f(*(undefined1 (*) [64])(local_268.m_storage.m_data + lVar29),
                                   *(undefined1 (*) [64])
                                    ((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                           .m_storage.m_data.array[0] + lVar29 * 8));
          *(undefined1 (*) [64])(local_268.m_storage.m_data + lVar29) = auVar35;
          lVar29 = lVar29 + 8;
        } while (lVar29 < (long)dVar27);
      }
      if ((long)dVar27 < local_268.m_storage.m_rows) {
        do {
          local_268.m_storage.m_data[(long)dVar27] =
               local_268.m_storage.m_data[(long)dVar27] -
               *(double *)
                ((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0] + dVar27 * 8);
          dVar27 = (double)((long)dVar27 + 1);
        } while ((double)local_268.m_storage.m_rows != dVar27);
LAB_00672064:
        free(*(void **)((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] + -8));
      }
      else if ((double *)
               local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] != (double *)0x0) goto LAB_00672064;
      if (CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
          0.0) {
        free(*(void **)((long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] - 8));
      }
      goto LAB_00672089;
    }
LAB_00672ba9:
    pcVar21 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
    ;
    goto LAB_00672c47;
  }
LAB_00672089:
  if (Kfactor) {
    CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&CStack_178,0xc);
    (*(pCVar25->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [6])(pCVar25,&CStack_178);
    if ((double)(pCVar25->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols !=
        CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
    goto LAB_00672b4c;
    local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_228,
               (pCVar25->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows,1);
    dVar27 = (double)(pCVar25->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
    if (local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
        dVar27) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_228,
                 (Index)dVar27,1);
      dVar27 = local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
    }
    if ((long)dVar27 < 0) goto LAB_00672b2d;
    if (dVar27 != 0.0) {
      memset((void *)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0],0,(long)dVar27 << 3);
    }
    local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_228,&pCVar25->Km,
               (Matrix<double,__1,_1,_0,__1,_1> *)&CStack_178,(Scalar *)&local_108);
    if ((double)local_268.m_storage.m_rows !=
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
    goto LAB_00672ba9;
    dVar27 = (double)(local_268.m_storage.m_rows + 7);
    if (-1 < local_268.m_storage.m_rows) {
      dVar27 = (double)local_268.m_storage.m_rows;
    }
    dVar27 = (double)((ulong)dVar27 & 0xfffffffffffffff8);
    if (7 < local_268.m_storage.m_rows) {
      lVar29 = 0;
      do {
        auVar35 = vsubpd_avx512f(*(undefined1 (*) [64])(local_268.m_storage.m_data + lVar29),
                                 *(undefined1 (*) [64])
                                  ((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[0] + lVar29 * 8));
        *(undefined1 (*) [64])(local_268.m_storage.m_data + lVar29) = auVar35;
        lVar29 = lVar29 + 8;
      } while (lVar29 < (long)dVar27);
    }
    if ((long)dVar27 < local_268.m_storage.m_rows) {
      do {
        local_268.m_storage.m_data[(long)dVar27] =
             local_268.m_storage.m_data[(long)dVar27] -
             *(double *)
              ((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0] + dVar27 * 8);
        dVar27 = (double)((long)dVar27 + 1);
      } while ((double)local_268.m_storage.m_rows != dVar27);
LAB_006721d8:
      free(*(void **)((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0] + -8));
    }
    else if ((double *)
             local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
             != (double *)0x0) goto LAB_006721d8;
    if (CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
        0.0) {
      free(*(void **)((long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0] - 8));
    }
  }
  if (!Rfactor) goto LAB_00672393;
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_16_ =
       ZEXT816(0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_108,0xc);
  GetField_dt(pCVar25,(ChVectorDynamic<> *)&local_108);
  if ((double)(pCVar25->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols !=
      local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) {
LAB_00672b4c:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  lVar29 = (pCVar25->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if (lVar29 < 0) {
LAB_00672bf9:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&local_228,lVar29,lVar29,1);
  dVar27 = (double)(pCVar25->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  if ((local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] !=
       dVar27) ||
     (dVar24 = 4.94065645841247e-324,
     local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
     4.94065645841247e-324)) {
    if ((long)dVar27 < 0) goto LAB_00672bf9;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_228,(Index)dVar27,(Index)dVar27,1);
    dVar27 = local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    dVar24 = local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  }
  CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar27;
  CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar24;
  if ((long)((ulong)dVar27 | (ulong)dVar24) < 0) {
    pcVar21 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
    ;
LAB_00672b42:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar21);
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_228,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)&CStack_178,(assign_op<double,_double> *)&local_1d8);
  CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
  ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)&local_228,&pCVar25->Rm,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_108,(Scalar *)&CStack_178);
  if (((double)local_268.m_storage.m_rows !=
       local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]) ||
     (local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] !=
      4.94065645841247e-324)) {
    pcVar21 = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
    ;
LAB_00672c47:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar21);
  }
  if (local_268.m_storage.m_rows < 1) {
    if ((double *)
        local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
        (double *)0x0) goto LAB_00672374;
  }
  else {
    dVar27 = 0.0;
    do {
      local_268.m_storage.m_data[(long)dVar27] =
           local_268.m_storage.m_data[(long)dVar27] -
           *(double *)
            ((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0] + dVar27 * 8);
      dVar27 = (double)((long)dVar27 + 1);
    } while ((double)local_268.m_storage.m_rows != dVar27);
LAB_00672374:
    free(*(void **)((long)local_228.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[0] + -8));
  }
  if ((double *)
      local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
      (double *)0x0) {
    free(*(void **)((long)local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[0] + 0xfffffffffffffff8));
  }
LAB_00672393:
  ChMatrix33<double>::ChMatrix33(&CStack_178,&pCVar25->q_element_abs_rot);
  psVar10 = (pCVar25->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar11 = (psVar10->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var26 = (psVar10->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
    }
  }
  auVar33 = *(undefined1 (*) [32])(pCVar25->q_element_abs_rot).m_data;
  auVar34 = vpermpd_avx2(*(undefined1 (*) [32])((pCVar25->q_element_abs_rot).m_data + 2),0x15);
  auVar50 = vpermpd_avx2(auVar33,1);
  auVar39._0_8_ = *(ulong *)&peVar11->field_0x40 ^ 0x8000000000000000;
  auVar39._8_8_ = *(ulong *)&peVar11->field_0x48 ^ 0x8000000000000000;
  auVar39._16_8_ = 0x8000000000000000;
  auVar39._24_8_ = 0x8000000000000000;
  uVar45 = *(ulong *)&peVar11->field_0x50 ^ 0x8000000000000000;
  auVar47._24_8_ = 0x8000000000000000;
  auVar47._16_8_ = uVar45;
  auVar17 = vpermpd_avx2(auVar39,0xd0);
  auVar55._8_8_ = uVar45;
  auVar55._0_8_ = uVar45;
  auVar55._16_8_ = uVar45;
  auVar55._24_8_ = uVar45;
  auVar47._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
  auVar43._16_8_ = *(ulong *)&peVar11->field_0x40;
  auVar43._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
  auVar43._24_8_ = 0;
  auVar39 = vpermpd_avx2(auVar39,0x11);
  auVar17 = vblendpd_avx(auVar17,ZEXT832(*(ulong *)&peVar11->field_0x40),1);
  auVar17 = vblendpd_avx(auVar17,auVar55,8);
  auVar47 = vpermpd_avx2(auVar47,0x24);
  auVar39 = vshufpd_avx(auVar43,auVar39,9);
  auVar53._0_8_ = auVar50._0_8_ * auVar17._0_8_;
  auVar53._8_8_ = auVar50._8_8_ * auVar17._8_8_;
  auVar53._16_8_ = auVar50._16_8_ * auVar17._16_8_;
  auVar53._24_8_ = auVar50._24_8_ * auVar17._24_8_;
  uVar4 = *(undefined8 *)&peVar11->field_0x38;
  auVar17._8_8_ = uVar4;
  auVar17._0_8_ = uVar4;
  auVar17._16_8_ = uVar4;
  auVar17._24_8_ = uVar4;
  auVar33 = vfmadd231pd_avx512vl(auVar53,auVar33,auVar17);
  dVar27 = (pCVar25->q_element_abs_rot).m_data[2];
  auVar50._8_8_ = dVar27;
  auVar50._0_8_ = dVar27;
  dVar27 = (pCVar25->q_element_abs_rot).m_data[1];
  auVar50._24_8_ = dVar27;
  auVar50._16_8_ = dVar27;
  auVar18 = vfmadd213pd_fma(auVar50,auVar47,auVar33);
  auVar18 = vfmadd213pd_fma(auVar39,auVar34,ZEXT1632(auVar18));
  local_108.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_32_ =
       ZEXT1632(auVar18);
  ChMatrix33<double>::ChMatrix33(&local_228,(ChQuaternion<double> *)&local_108);
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
  }
  psVar10 = (pCVar25->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar11 = psVar10[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var26 = psVar10[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
    }
  }
  auVar33 = *(undefined1 (*) [32])(local_250->q_element_abs_rot).m_data;
  auVar34 = vpermpd_avx2(*(undefined1 (*) [32])((local_250->q_element_abs_rot).m_data + 2),0x15);
  auVar40._0_8_ = *(ulong *)&peVar11->field_0x40 ^ 0x8000000000000000;
  auVar40._8_8_ = *(ulong *)&peVar11->field_0x48 ^ 0x8000000000000000;
  auVar40._16_8_ = 0x8000000000000000;
  auVar40._24_8_ = 0x8000000000000000;
  uVar45 = *(ulong *)&peVar11->field_0x50 ^ 0x8000000000000000;
  auVar48._24_8_ = 0x8000000000000000;
  auVar48._16_8_ = uVar45;
  auVar17 = vpermpd_avx2(auVar40,0xd0);
  auVar56._8_8_ = uVar45;
  auVar56._0_8_ = uVar45;
  auVar56._16_8_ = uVar45;
  auVar56._24_8_ = uVar45;
  auVar48._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
  auVar44._16_8_ = *(ulong *)&peVar11->field_0x40;
  auVar44._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
  auVar44._24_8_ = 0;
  auVar39 = vpermpd_avx2(auVar40,0x11);
  auVar17 = vblendpd_avx(auVar17,ZEXT832(*(ulong *)&peVar11->field_0x40),1);
  auVar17 = vblendpd_avx(auVar17,auVar56,8);
  auVar50 = vpermpd_avx2(auVar48,0x24);
  auVar39 = vshufpd_avx(auVar44,auVar39,9);
  auVar47 = vpermpd_avx2(auVar33,1);
  auVar54._0_8_ = auVar47._0_8_ * auVar17._0_8_;
  auVar54._8_8_ = auVar47._8_8_ * auVar17._8_8_;
  auVar54._16_8_ = auVar47._16_8_ * auVar17._16_8_;
  auVar54._24_8_ = auVar47._24_8_ * auVar17._24_8_;
  uVar4 = *(undefined8 *)&peVar11->field_0x38;
  auVar19._8_8_ = uVar4;
  auVar19._0_8_ = uVar4;
  auVar19._16_8_ = uVar4;
  auVar19._24_8_ = uVar4;
  auVar33 = vfmadd231pd_avx512vl(auVar54,auVar33,auVar19);
  dVar27 = (local_250->q_element_abs_rot).m_data[2];
  auVar51._8_8_ = dVar27;
  auVar51._0_8_ = dVar27;
  dVar27 = (local_250->q_element_abs_rot).m_data[1];
  auVar51._24_8_ = dVar27;
  auVar51._16_8_ = dVar27;
  auVar18 = vfmadd213pd_fma(auVar51,auVar50,auVar33);
  auVar18 = vfmadd213pd_fma(auVar39,auVar34,ZEXT1632(auVar18));
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  ._0_32_ = ZEXT1632(auVar18);
  ChMatrix33<double>::ChMatrix33(&local_108,(ChQuaternion<double> *)&local_1d8);
  if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
  }
  local_248.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
  local_248.
  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)&CStack_178;
  std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
  _M_realloc_insert<chrono::ChMatrix33<double>*>
            ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
             &local_248,(iterator)0x0,(ChMatrix33<double> **)&local_1d8);
  pCVar25 = local_250;
  if (local_248.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_1d8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&local_228;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_248,
               (iterator)
               local_248.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_1d8);
  }
  else {
    *local_248.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_228;
    local_248.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pCVar20 = local_230;
  if (local_248.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_1d8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&CStack_178;
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_248,
               (iterator)
               local_248.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_1d8);
  }
  else {
    *local_248.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &CStack_178;
    local_248.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)&local_108;
  if (local_248.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_248.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
    _M_realloc_insert<chrono::ChMatrix33<double>*>
              ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
               &local_248,
               (iterator)
               local_248.
               super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_1d8);
  }
  else {
    *local_248.
     super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = &local_108;
    local_248.
    super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_248.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 0;
  local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0;
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_rows.m_value = local_268.m_storage.m_rows;
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = local_268.m_storage.m_data;
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_cols.m_value = 1;
  local_1d8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .m_stride.m_outer.m_value = 0;
  if (local_268.m_storage.m_rows < 0 && local_268.m_storage.m_data != (double *)0x0) {
    pcVar21 = 
    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
    ;
  }
  else {
    local_a0.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 0;
    local_1d8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .m_stride.m_outer.m_value = 1;
    local_a0.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (pCVar20->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    local_a0.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_rows.m_value =
         (pCVar20->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    local_a0.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_cols.m_value = 1;
    if (-1 < local_a0.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value ||
        local_a0.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data == (double *)0x0) {
      local_a0.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 1;
      ChMatrixCorotation::ComputeCK(&local_1d8,&local_248,4,&local_a0);
      if (local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_data != (double *)0x0) {
        free((void *)local_1d8.m_object.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_data[-1]);
      }
      if (local_78[0] != '\0') {
        local_1d8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 0;
        local_128[2] = 0.0;
        local_1d8.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        ._0_16_ = ZEXT816(0);
        local_128[0] = 0.0;
        local_128[1] = 0.0;
        if ((pCVar25->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pCVar25->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar31 = 0x18;
          lVar29 = 0;
          uVar45 = 0;
          local_b8._8_8_ = 0;
          local_b8._0_8_ = (pCVar25->super_ChElementBeam).length * 0.5;
          _local_78 = vbroadcastsd_avx512f(local_b8);
          do {
            peVar12 = (pCVar25->tapered_section).
                      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            if (uVar45 == 0) {
              peVar13 = (peVar12->sectionA).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var26 = (peVar12->sectionA).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)
                         &(((((local_250->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->super_ChNodeFEAbase).field_0x18);
              (**(code **)(*(long *)&(peVar13->super_ChBeamSectionRayleighAdvancedGeneric).
                                     super_ChBeamSectionEulerAdvancedGeneric.
                                     super_ChBeamSectionEuler + 0x80))
                        (peVar13,&local_1d8,local_128,local_190);
            }
            else {
              peVar13 = (peVar12->sectionB).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var26 = (peVar12->sectionB).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var26->_M_use_count = p_Var26->_M_use_count + 1;
                }
              }
              ChFrameMoving<double>::GetWvel_loc
                        ((ChFrameMoving<double> *)
                         &(((local_250->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar45].
                            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ChNodeFEAbase).field_0x18);
              (**(code **)(*(long *)&(peVar13->super_ChBeamSectionRayleighAdvancedGeneric).
                                     super_ChBeamSectionEulerAdvancedGeneric.
                                     super_ChBeamSectionEuler + 0x80))
                        (peVar13,&local_1d8,local_128,local_190);
            }
            if (p_Var26 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var26);
            }
            auVar38._8_8_ = 0;
            auVar38._0_8_ =
                 local_1d8.
                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
            auVar49._8_8_ = 0;
            auVar49._0_8_ =
                 local_1d8.
                 super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value;
            peVar11 = (local_250->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar45].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = *(ulong *)&peVar11->field_0x58;
            auVar46._8_8_ = 0;
            auVar46._0_8_ =
                 (double)local_1d8.
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         .
                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_rows.m_value * *(double *)&peVar11->field_0x60;
            auVar18 = vfmadd231sd_fma(auVar46,auVar38,auVar18);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)&peVar11->field_0x70;
            auVar52._8_8_ = 0;
            auVar52._0_8_ =
                 (double)local_1d8.
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         .
                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_rows.m_value * *(double *)&peVar11->field_0x78;
            auVar5 = vfmadd231sd_fma(auVar52,auVar38,auVar5);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)&peVar11->field_0x88;
            auVar42._8_8_ = 0;
            auVar42._0_8_ =
                 (double)local_1d8.
                         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         .
                         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_rows.m_value * *(double *)&peVar11->field_0x90;
            auVar6 = vfmadd231sd_fma(auVar42,auVar38,auVar6);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)&peVar11->field_0x68;
            auVar18 = vfmadd231sd_fma(auVar18,auVar49,auVar7);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)&peVar11->field_0x80;
            auVar5 = vfmadd231sd_fma(auVar5,auVar49,auVar8);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)&peVar11->field_0x98;
            auVar6 = vfmadd231sd_fma(auVar6,auVar49,auVar9);
            local_190[0] = auVar18._0_8_;
            local_190[1] = auVar5._0_8_;
            local_190[2] = auVar6._0_8_;
            lVar23 = (local_230->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows + -3;
            if (lVar23 < (long)(uVar45 * 6)) goto LAB_00672b0b;
            pdVar14 = (local_230->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            uVar22 = 3;
            pauVar1 = (undefined1 (*) [64])(pdVar14 + uVar45 * 6);
            if (((ulong)pauVar1 & 7) == 0) {
              uVar30 = -((uint)((ulong)pauVar1 >> 3) & 0x1fffffff) & 7;
              if (uVar30 < 3) {
                uVar22 = uVar30;
              }
              if (uVar30 != 0) goto LAB_00672991;
            }
            else {
LAB_00672991:
              auVar35 = vpbroadcastq_avx512f();
              uVar32 = vpcmpuq_avx512f(auVar35,_DAT_00975000,5);
              bVar15 = (byte)uVar32;
              auVar35._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * auVar5._0_8_;
              auVar35._0_8_ = (ulong)(bVar15 & 1) * auVar18._0_8_;
              auVar35._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * auVar6._0_8_;
              auVar35._24_8_ =
                   (ulong)((byte)(uVar32 >> 3) & 1) *
                   (long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[0];
              auVar35._32_8_ =
                   (ulong)((byte)(uVar32 >> 4) & 1) *
                   (long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[1];
              auVar35._40_8_ =
                   (ulong)((byte)(uVar32 >> 5) & 1) *
                   (long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[2];
              auVar35._48_8_ =
                   (ulong)((byte)(uVar32 >> 6) & 1) *
                   (long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[3];
              auVar35._56_8_ =
                   (uVar32 >> 7) *
                   (long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[4];
              auVar36._8_8_ =
                   (ulong)((byte)(uVar32 >> 1) & 1) * (long)*(double *)((long)*pauVar1 + 8);
              auVar36._0_8_ = (ulong)(bVar15 & 1) * (long)*(double *)*pauVar1;
              auVar36._16_8_ =
                   (ulong)((byte)(uVar32 >> 2) & 1) * (long)*(double *)((long)*pauVar1 + 0x10);
              auVar36._24_8_ =
                   (ulong)((byte)(uVar32 >> 3) & 1) * (long)*(double *)((long)*pauVar1 + 0x18);
              auVar36._32_8_ =
                   (ulong)((byte)(uVar32 >> 4) & 1) * (long)*(double *)((long)*pauVar1 + 0x20);
              auVar36._40_8_ =
                   (ulong)((byte)(uVar32 >> 5) & 1) * (long)*(double *)((long)*pauVar1 + 0x28);
              auVar36._48_8_ =
                   (ulong)((byte)(uVar32 >> 6) & 1) * (long)*(double *)((long)*pauVar1 + 0x30);
              auVar36._56_8_ = (uVar32 >> 7) * (long)*(double *)((long)*pauVar1 + 0x38);
              auVar35 = vmulpd_avx512f(auVar35,_local_78);
              auVar35 = vsubpd_avx512f(auVar36,auVar35);
              auVar37._0_8_ =
                   (ulong)(bVar15 & 1) * auVar35._0_8_ |
                   (ulong)!(bool)(bVar15 & 1) * (long)*(double *)*pauVar1;
              bVar16 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar37._8_8_ =
                   (ulong)bVar16 * auVar35._8_8_ |
                   (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 8);
              bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar37._16_8_ =
                   (ulong)bVar16 * auVar35._16_8_ |
                   (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x10);
              bVar16 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar37._24_8_ =
                   (ulong)bVar16 * auVar35._24_8_ |
                   (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x18);
              bVar16 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar37._32_8_ =
                   (ulong)bVar16 * auVar35._32_8_ |
                   (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x20);
              bVar16 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar37._40_8_ =
                   (ulong)bVar16 * auVar35._40_8_ |
                   (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x28);
              bVar16 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar37._48_8_ =
                   (ulong)bVar16 * auVar35._48_8_ |
                   (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x30);
              auVar37._56_8_ =
                   (uVar32 >> 7) * auVar35._56_8_ |
                   (ulong)!SUB81(uVar32 >> 7,0) * (long)*(double *)((long)*pauVar1 + 0x38);
              *pauVar1 = auVar37;
            }
            if (uVar22 < 3) {
              uVar28 = (ulong)(uVar22 << 3);
              auVar33 = vpbroadcastq_avx512vl();
              uVar32 = vpcmpuq_avx512vl(auVar33,_DAT_00955380,5);
              uVar32 = uVar32 & 0xf;
              bVar15 = (byte)uVar32;
              plVar2 = (long *)((long)*pauVar1 + uVar28);
              auVar33._8_8_ = (ulong)((byte)(uVar32 >> 1) & 1) * plVar2[1];
              auVar33._0_8_ = (ulong)(bVar15 & 1) * *plVar2;
              auVar33._16_8_ = (ulong)((byte)(uVar32 >> 2) & 1) * plVar2[2];
              auVar33._24_8_ = (uVar32 >> 3) * plVar2[3];
              auVar41._0_8_ =
                   (double)((ulong)(bVar15 & 1) * *(long *)((long)local_190 + uVar28)) *
                   (double)local_78._0_8_;
              auVar41._8_8_ =
                   (double)((ulong)((byte)(uVar32 >> 1) & 1) *
                           *(long *)((long)local_190 + uVar28 + 8)) * (double)local_78._8_8_;
              auVar41._16_8_ =
                   (double)((ulong)((byte)(uVar32 >> 2) & 1) *
                           *(long *)((long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                           .m_storage.m_data.array + (uVar28 - 8))) * dStack_68;
              auVar41._24_8_ =
                   (double)((uVar32 >> 3) *
                           *(long *)((long)CStack_178.super_Matrix<double,_3,_3,_1,_3,_3>.
                                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                           .m_storage.m_data.array + uVar28)) * dStack_60;
              auVar33 = vsubpd_avx(auVar33,auVar41);
              pauVar3 = (undefined1 (*) [32])((long)*pauVar1 + uVar28);
              auVar34._0_8_ =
                   (ulong)(bVar15 & 1) * auVar33._0_8_ |
                   (ulong)!(bool)(bVar15 & 1) * *(long *)*pauVar3;
              bVar16 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar34._8_8_ =
                   (ulong)bVar16 * auVar33._8_8_ | (ulong)!bVar16 * *(long *)(*pauVar3 + 8);
              bVar16 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar34._16_8_ =
                   (ulong)bVar16 * auVar33._16_8_ | (ulong)!bVar16 * *(long *)(*pauVar3 + 0x10);
              auVar34._24_8_ =
                   (uVar32 >> 3) * auVar33._24_8_ |
                   (ulong)!SUB81(uVar32 >> 3,0) * *(long *)(*pauVar3 + 0x18);
              *pauVar3 = auVar34;
            }
            if (lVar23 < (long)(uVar45 * 6 + 3)) {
LAB_00672b0b:
              __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                            "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                           );
            }
            uVar32 = 3;
            if (((ulong)(pdVar14 + uVar45 * 6 + 3) & 7) == 0) {
              uVar22 = -((uint)((ulong)(pdVar14 + uVar45 * 6 + 3) >> 3) & 0x1fffffff) & 7;
              if ((ulong)uVar22 < 3) {
                uVar32 = (ulong)uVar22;
              }
              if (uVar22 != 0) goto LAB_00672a4f;
            }
            else {
LAB_00672a4f:
              uVar28 = 0;
              do {
                *(double *)((long)pdVar14 + uVar28 * 8 + lVar31) =
                     *(double *)((long)pdVar14 + uVar28 * 8 + lVar31) -
                     (double)local_b8._0_8_ * local_128[uVar28];
                uVar28 = uVar28 + 1;
              } while (uVar32 != uVar28);
            }
            if (uVar32 < 3) {
              lVar23 = uVar32 + 3;
              do {
                *(double *)((long)pdVar14 + lVar23 * 8 + lVar29) =
                     *(double *)((long)pdVar14 + lVar23 * 8 + lVar29) -
                     (double)local_b8._0_8_ * local_128[lVar23 + -3];
                lVar23 = lVar23 + 1;
              } while (lVar23 != 6);
            }
            uVar45 = uVar45 + 1;
            lVar31 = lVar31 + 0x30;
            lVar29 = lVar29 + 0x30;
            pCVar25 = local_250;
          } while (uVar45 < (ulong)((long)(local_250->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_250->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      if (local_248.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_268.m_storage.m_data != (double *)0x0) {
        free((void *)local_268.m_storage.m_data[-1]);
      }
      return;
    }
    pcVar21 = 
    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar21);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<>& Fi,
                                                           bool Mfactor,
                                                           bool Kfactor,
                                                           bool Rfactor,
                                                           bool Gfactor) {
    assert(Fi.size() == 12);
    assert(tapered_section);

    ChVectorDynamic<> FiMKR_local(12);
    FiMKR_local.setZero();

    if (Mfactor && true) {
        // set up vector of nodal accelerations (in local element system)
        ChVectorDynamic<> displ_dtdt(12);
        this->GetField_dtdt(displ_dtdt);

        ChVectorDynamic<> FiM_local = this->M * displ_dtdt;  // this->M is the local mass matrix of element
        FiMKR_local -= FiM_local;
    }

    if (Kfactor) {
        // set up vector of nodal displacements and small rotations (in local element system)
        ChVectorDynamic<> displ(12);
        this->GetStateBlock(displ);

        // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
        ChVectorDynamic<> FiK_local = this->Km * displ;
        FiMKR_local -= FiK_local;
    }
    if (Rfactor) {
        // set up vector of nodal velocities (in local element system)
        ChVectorDynamic<> displ_dt(12);
        this->GetField_dt(displ_dt);

        // ChMatrixDynamic<> FiR_local = this->tapered_section->GetBeamRaleyghDamping() * this->Km * displ_dt;
        ChMatrixDynamic<> FiR_local = this->Rm * displ_dt;
        FiMKR_local -= FiR_local;
    }

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(FiMKR_local, R, 4, Fi);

    // DO NOT USE THIS PIECE OF CODE.
    // if (Mfactor && false) {  // Is this correct? Or the code in lines 1029~1036
    //    // set up vector of nodal accelarations (in absolute element system)
    //    ChVectorDynamic<> displ_dtdt(12);
    //    displ_dtdt.segment(0, 3) = nodes[0]->Frame().GetPos_dtdt().eigen();
    //    // displ_dtdt.segment(3, 3) = nodes[0]->Frame().GetWacc_par().eigen();        //但是之后dynamics求解发散
    //    displ_dtdt.segment(3, 3) = nodes[0]->Frame().GetWacc_loc().eigen();  //但是之后dynamics求解发散

    //    displ_dtdt.segment(6, 3) = nodes[1]->Frame().GetPos_dtdt().eigen();
    //    // displ_dtdt.segment(9, 3) = nodes[1]->Frame().GetWacc_par().eigen();
    //    displ_dtdt.segment(9, 3) = nodes[1]->Frame().GetWacc_loc().eigen();
    //    // this->GetField_dtdt(displ_dtdt);

    //    ChMatrixDynamic<> Mabs(12, 12);
    //    Mabs.setZero();
    //    this->ComputeKRMmatricesGlobal(Mabs, false, false,
    //                                   true);  // Mabs is the mass matrix in absolute coordinate for this element

    //    ChVectorDynamic<> FiM_abs = Mabs * displ_dtdt;
    //    Fi -= FiM_abs;
    //}

    if (Gfactor) {
        // Add also inertial quadratic terms: gyroscopic and centrifugal

        // CASE OF LUMPED MASS - fast
        double node_multiplier = 0.5 * length;
        ChVector<> mFcent_i;
        ChVector<> mTgyro_i;
        for (int i = 0; i < nodes.size(); ++i) {
            // int stride = i * 6;
            if (i == 0) {
                this->tapered_section->GetSectionA()->ComputeQuadraticTerms(mFcent_i, mTgyro_i,
                                                                            nodes[i]->GetWvel_loc());
            } else {  // i==1
                this->tapered_section->GetSectionB()->ComputeQuadraticTerms(mFcent_i, mTgyro_i,
                                                                            nodes[i]->GetWvel_loc());
            }
            ChQuaternion<> q_i(nodes[i]->GetRot());
            Fi.segment(i * 6, 3) -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
            Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
        }
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}